

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::MkdirCommand::getVerboseDescription
          (MkdirCommand *this,SmallVectorImpl<char> *result)

{
  ulong uVar1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *pvVar2;
  const_reference ppBVar3;
  unsigned_long *puVar4;
  void *pvVar5;
  raw_ostream *prVar6;
  StringRef SVar7;
  StringRef local_88;
  undefined1 local_78 [8];
  raw_svector_ostream os;
  SmallVectorImpl<char> *result_local;
  MkdirCommand *this_local;
  void *P;
  size_t FindBegin;
  char local_19;
  StringRef *local_18;
  long local_10;
  
  os.OS = result;
  llvm::raw_svector_ostream::raw_svector_ostream((raw_svector_ostream *)local_78,result);
  llvm::raw_ostream::operator<<((raw_ostream *)local_78,"mkdir -p ");
  pvVar2 = llbuild::buildsystem::Command::getOutputs((Command *)this);
  ppBVar3 = std::
            vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ::operator[](pvVar2,0);
  local_88 = llbuild::buildsystem::Node::getName(&(*ppBVar3)->super_Node);
  local_18 = &local_88;
  local_19 = ' ';
  FindBegin = 0;
  puVar4 = std::min<unsigned_long>(&FindBegin,&local_88.Length);
  uVar1 = *puVar4;
  if (uVar1 < local_88.Length) {
    pvVar5 = memchr(local_88.Data + uVar1,(int)local_19,local_88.Length - uVar1);
    if (pvVar5 != (void *)0x0) {
      local_10 = (long)pvVar5 - (long)local_88.Data;
      goto LAB_00273352;
    }
  }
  local_10 = -1;
LAB_00273352:
  if (local_10 == -1) {
    pvVar2 = llbuild::buildsystem::Command::getOutputs((Command *)this);
    ppBVar3 = std::
              vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ::operator[](pvVar2,0);
    SVar7 = llbuild::buildsystem::Node::getName(&(*ppBVar3)->super_Node);
    llvm::raw_ostream::operator<<((raw_ostream *)local_78,SVar7);
  }
  else {
    prVar6 = llvm::raw_ostream::operator<<((raw_ostream *)local_78,'\"');
    pvVar2 = llbuild::buildsystem::Command::getOutputs((Command *)this);
    ppBVar3 = std::
              vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ::operator[](pvVar2,0);
    SVar7 = llbuild::buildsystem::Node::getName(&(*ppBVar3)->super_Node);
    prVar6 = llvm::raw_ostream::operator<<(prVar6,SVar7);
    llvm::raw_ostream::operator<<(prVar6,'\"');
  }
  llvm::raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_78);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    os << "mkdir -p ";
    // FIXME: This isn't correct, we need utilities for doing shell quoting.
    if (StringRef(getOutputs()[0]->getName()).find(' ') != StringRef::npos) {
      os << '"' << getOutputs()[0]->getName() << '"';
    } else {
      os << getOutputs()[0]->getName();
    }
  }